

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O3

float __thiscall
NeuralNetwork::test(NeuralNetwork *this,
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *test_xs,vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            *test_ys)

{
  pointer pvVar1;
  NeuralNetwork *this_00;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Index realMaxRow;
  Index predMaxRow;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  yvecs;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  xvecs;
  float local_b4;
  void *local_a8 [2];
  long local_98;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_90;
  void *local_88;
  long local_80;
  NeuralNetwork *local_70;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_68;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_48;
  
  lVar3 = (long)(test_xs->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(test_xs->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_90 = test_ys;
  if (lVar3 != (long)(test_ys->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(test_ys->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("test_xs.size() == test_ys.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Everglow123[P]NN/neural_network.cpp"
                  ,0xa0,
                  "float NeuralNetwork::test(std::vector<std::vector<float>> &, std::vector<std::vector<float>> &)"
                 );
  }
  local_48.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::reserve(&local_48,(lVar3 >> 3) * -0x5555555555555555);
  local_68.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::reserve(&local_68,
            ((long)(local_90->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_90->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_98 = (long)(test_xs->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(test_xs->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (local_98 >> 3) * -0x5555555555555555;
  local_b4 = 0.0;
  if (0 < local_98) {
    lVar4 = 1;
    if (1 < lVar3) {
      lVar4 = lVar3;
    }
    lVar5 = 8;
    lVar2 = lVar4;
    local_70 = this;
    do {
      pvVar1 = (test_xs->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_88 = *(void **)((long)pvVar1 + lVar5 + -8);
      local_80 = *(long *)((long)&(pvVar1->super__Vector_base<float,_std::allocator<float>_>).
                                  _M_impl.super__Vector_impl_data + lVar5) - (long)local_88 >> 2;
      if (local_80 < 0) goto LAB_00106564;
      Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_a8,
                 (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_88);
      std::vector<Eigen::Matrix<float,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<float,-1,1,0,-1,1>>>
      ::emplace_back<Eigen::Matrix<float,_1,1,0,_1,1>>
                ((vector<Eigen::Matrix<float,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<float,_1,1,0,_1,1>>>
                  *)&local_48,(Matrix<float,__1,_1,_0,__1,_1> *)local_a8);
      free(local_a8[0]);
      this_00 = local_70;
      lVar5 = lVar5 + 0x18;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    if (0 < local_98) {
      lVar2 = 8;
      do {
        pvVar1 = (local_90->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_88 = *(void **)((long)pvVar1 + lVar2 + -8);
        local_80 = *(long *)((long)&(pvVar1->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data + lVar2) - (long)local_88 >> 2;
        if (local_80 < 0) {
LAB_00106564:
          __assert_fail("vecSize >= 0","/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xa6,
                        "Eigen::MapBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>, Level = 0]"
                       );
        }
        Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                  ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_a8,
                   (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&local_88);
        std::
        vector<Eigen::Matrix<float,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<float,-1,1,0,-1,1>>>::
        emplace_back<Eigen::Matrix<float,_1,1,0,_1,1>>
                  ((vector<Eigen::Matrix<float,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<float,_1,1,0,_1,1>>>
                    *)&local_68,(Matrix<float,__1,_1,_0,__1,_1> *)local_a8);
        free(local_a8[0]);
        lVar2 = lVar2 + 0x18;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      if (0 < local_98) {
        lVar4 = 1;
        if (1 < lVar3) {
          lVar4 = lVar3;
        }
        lVar2 = 0;
        lVar5 = 0;
        do {
          forwardPropagation(this_00,(VectorXf *)
                                     ((long)&((local_48.
                                               super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                                             ).m_storage.m_data + lVar2));
          Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::maxCoeff<0,long>
                    ((DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)
                     &(this_00->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].output,(long *)&local_88);
          Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::maxCoeff<0,long>
                    ((DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)
                     ((long)&((local_68.
                               super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                             m_storage.m_data + lVar2),(long *)local_a8);
          lVar5 = lVar5 + (ulong)(local_88 == local_a8[0]);
          lVar2 = lVar2 + 0x10;
        } while (lVar4 * 0x10 != lVar2);
        local_b4 = (float)lVar5;
      }
    }
  }
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_68);
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_48);
  return local_b4 / (float)lVar3;
}

Assistant:

float NeuralNetwork::test(std::vector<std::vector<float>>& test_xs,
                          std::vector<std::vector<float>>& test_ys) {
    using namespace std;
    using namespace Eigen;
    assert(test_xs.size() == test_ys.size());
    vector<VectorXf> xvecs;
    xvecs.reserve(test_xs.size());
    vector<VectorXf> yvecs;
    yvecs.reserve(test_ys.size());

    ssize_t testDataSize = test_xs.size();
    ssize_t correctCount = 0;
    for (int i = 0; i < testDataSize; ++i) {
        xvecs.push_back(NeuralNetwork::stdVecToEigenVec(test_xs[i]));
    }
    for (int i = 0; i < testDataSize; ++i) {
        yvecs.push_back(NeuralNetwork::stdVecToEigenVec(test_ys[i]));
    }

    for (int i = 0; i < testDataSize; ++i) {
        this->forwardPropagation(xvecs[i]);
        VectorXf::Index predMaxRow, realMaxRow;
        this->layers_.back().output.maxCoeff(&predMaxRow);
        yvecs[i].maxCoeff(&realMaxRow);
        if (predMaxRow == realMaxRow) {
            correctCount++;
        }
    }
    // cout << correctCount << endl;
    return float(correctCount) / float(testDataSize);
}